

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_read_compressed_img_plane
              (fitsfile *fptr,int datatype,int bytesperpixel,long nplane,LONGLONG *firstcoord,
              LONGLONG *lastcoord,long *inc,long *naxes,int nullcheck,void *nullval,void *array,
              char *nullarray,int *anynul,long *nread,int *status)

{
  long lVar1;
  int local_bc;
  char *pcStack_b8;
  int tnull;
  char *nullarrayptr;
  char *arrayptr;
  LONGLONG trc [6];
  LONGLONG blc [6];
  LONGLONG *lastcoord_local;
  LONGLONG *firstcoord_local;
  long nplane_local;
  int bytesperpixel_local;
  int datatype_local;
  fitsfile *fptr_local;
  
  if (anynul != (int *)0x0) {
    *anynul = 0;
  }
  *nread = 0;
  nullarrayptr = (char *)array;
  pcStack_b8 = nullarray;
  trc[1] = nplane + 1;
  if (*firstcoord != 0) {
    trc[5] = *firstcoord + 1;
    trc[0] = firstcoord[1] + 1;
    if (lastcoord[1] == firstcoord[1]) {
      arrayptr = (char *)(*lastcoord + 1);
    }
    else {
      arrayptr = (char *)*naxes;
    }
    fits_read_compressed_img
              (fptr,datatype,trc + 5,(LONGLONG *)&arrayptr,inc,nullcheck,nullval,array,nullarray,
               &local_bc,status);
    *nread = (long)(arrayptr + *nread + (1 - trc[5]));
    if ((local_bc != 0) && (anynul != (int *)0x0)) {
      *anynul = 1;
    }
    if (lastcoord[1] == firstcoord[1]) {
      return *status;
    }
    *firstcoord = 0;
    firstcoord[1] = firstcoord[1] + 1;
    nullarrayptr = nullarrayptr + (long)(arrayptr + (1 - trc[5])) * (long)bytesperpixel;
    if ((pcStack_b8 != (char *)0x0) && (nullcheck == 2)) {
      pcStack_b8 = pcStack_b8 + (long)(arrayptr + (1 - trc[5]));
    }
  }
  trc[5] = 1;
  lVar1 = firstcoord[1] + 1;
  arrayptr = (char *)*naxes;
  if (*lastcoord + 1 == *naxes) {
    trc[0] = lastcoord[1] + 1;
  }
  else {
    trc[0] = lastcoord[1];
  }
  if (lVar1 <= trc[0]) {
    fits_read_compressed_img
              (fptr,datatype,trc + 5,(LONGLONG *)&arrayptr,inc,nullcheck,nullval,nullarrayptr,
               pcStack_b8,&local_bc,status);
    *nread = *nread + ((trc[0] - lVar1) + 1) * *naxes;
    if ((local_bc != 0) && (anynul != (int *)0x0)) {
      *anynul = 1;
    }
    if (lastcoord[1] + 1 == trc[0]) {
      return *status;
    }
    nullarrayptr = nullarrayptr + ((trc[0] - lVar1) + 1) * *naxes * (long)bytesperpixel;
    if ((pcStack_b8 != (char *)0x0) && (nullcheck == 2)) {
      pcStack_b8 = pcStack_b8 + ((trc[0] - lVar1) + 1) * *naxes;
    }
  }
  if (trc[0] == lastcoord[1] + 1) {
    fptr_local._4_4_ = *status;
  }
  else {
    arrayptr = (char *)(*lastcoord + 1);
    trc[0] = lastcoord[1] + 1;
    fits_read_compressed_img
              (fptr,datatype,trc + 5,(LONGLONG *)&arrayptr,inc,nullcheck,nullval,nullarrayptr,
               pcStack_b8,&local_bc,status);
    if ((local_bc != 0) && (anynul != (int *)0x0)) {
      *anynul = 1;
    }
    *nread = (long)(arrayptr + *nread + (1 - trc[5]));
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_read_compressed_img_plane(fitsfile *fptr, /* I - FITS file   */
            int  datatype,  /* I - datatype of the array to be returned      */
            int  bytesperpixel, /* I - number of bytes per pixel in array */
            long   nplane,  /* I - which plane of the cube to read      */
            LONGLONG *firstcoord,  /* coordinate of first pixel to read */
            LONGLONG *lastcoord,   /* coordinate of last pixel to read */
            long *inc,         /* increment of pixels to read */
            long *naxes,      /* size of each image dimension */
            int  nullcheck,  /* I - 0 for no null checking                   */
                              /*     1: set undefined pixels = nullval       */
                              /*     2: set nullarray=1 for undefined pixels */
            void *nullval,    /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - array of flags = 1 if nullcheck = 2     */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            long *nread,      /* O - total number of pixels read and returned*/
            int  *status)     /* IO - error status                           */

   /*
           in general we have to read the first partial row of the image,
           followed by the middle complete rows, followed by the last
           partial row of the image.  If the first or last rows are complete,
           then read them at the same time as all the middle rows.
    */
{
     /* bottom left coord. and top right coord. */
    LONGLONG blc[MAX_COMPRESS_DIM], trc[MAX_COMPRESS_DIM]; 
    char *arrayptr, *nullarrayptr;
    int tnull;

    if (anynul)
        *anynul = 0;

    *nread = 0;

    arrayptr = (char *) array;
    nullarrayptr = nullarray;

    blc[2] = nplane + 1;
    trc[2] = nplane + 1;

    if (firstcoord[0] != 0)
    { 
            /* have to read a partial first row */
            blc[0] = firstcoord[0] + 1;
            blc[1] = firstcoord[1] + 1;
            trc[1] = blc[1];  
            if (lastcoord[1] == firstcoord[1])
               trc[0] = lastcoord[0] + 1; /* 1st and last pixels in same row */
            else
               trc[0] = naxes[0];  /* read entire rest of the row */

            fits_read_compressed_img(fptr, datatype, blc, trc, inc,
                nullcheck, nullval, arrayptr, nullarrayptr, &tnull, status);

            *nread = *nread + (long) (trc[0] - blc[0] + 1);

            if (tnull && anynul)
               *anynul = 1;  /* there are null pixels */

            if (lastcoord[1] == firstcoord[1])
            {
               return(*status);  /* finished */
            }

            /* set starting coord to beginning of next line */
            firstcoord[0] = 0;
            firstcoord[1] += 1;
            arrayptr = arrayptr + (trc[0] - blc[0] + 1) * bytesperpixel;
            if (nullarrayptr && (nullcheck == 2) )
                nullarrayptr = nullarrayptr + (trc[0] - blc[0] + 1);

    }

    /* read contiguous complete rows of the image, if any */
    blc[0] = 1;
    blc[1] = firstcoord[1] + 1;
    trc[0] = naxes[0];

    if (lastcoord[0] + 1 == naxes[0])
    {
            /* can read the last complete row, too */
            trc[1] = lastcoord[1] + 1;
    }
    else
    {
            /* last row is incomplete; have to read it separately */
            trc[1] = lastcoord[1];
    }

    if (trc[1] >= blc[1])  /* must have at least one whole line to read */
    {
        fits_read_compressed_img(fptr, datatype, blc, trc, inc,
                nullcheck, nullval, arrayptr, nullarrayptr, &tnull, status);

        *nread = *nread + (long) ((trc[1] - blc[1] + 1) * naxes[0]);

        if (tnull && anynul)
           *anynul = 1;

        if (lastcoord[1] + 1 == trc[1])
               return(*status);  /* finished */

        /* increment pointers for the last partial row */
        arrayptr = arrayptr + (trc[1] - blc[1] + 1) * naxes[0] * bytesperpixel;
        if (nullarrayptr && (nullcheck == 2) )
                nullarrayptr = nullarrayptr + (trc[1] - blc[1] + 1) * naxes[0];
     }

    if (trc[1] == lastcoord[1] + 1)
        return(*status);           /* all done */

    /* set starting and ending coord to last line */

    trc[0] = lastcoord[0] + 1;
    trc[1] = lastcoord[1] + 1;
    blc[1] = trc[1];

    fits_read_compressed_img(fptr, datatype, blc, trc, inc,
                nullcheck, nullval, arrayptr, nullarrayptr, &tnull, status);

    if (tnull && anynul)
       *anynul = 1;

    *nread = *nread + (long) (trc[0] - blc[0] + 1);

    return(*status);
}